

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_UInt tt_cmap4_char_index(TT_CMap cmap,FT_UInt32 char_code)

{
  FT_UInt FVar1;
  FT_UInt32 local_4;
  
  FVar1 = 0;
  if (char_code < 0x10000) {
    if ((cmap->flags & 1) == 0) {
      FVar1 = tt_cmap4_char_map_binary(cmap,&local_4,'\0');
    }
    else {
      FVar1 = tt_cmap4_char_map_linear
                        ((TT_CMap)(cmap->cmap).charmap.face,(FT_UInt32 *)cmap->data,
                         (FT_Bool)&local_4);
    }
  }
  return FVar1;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  tt_cmap4_char_index( TT_CMap    cmap,
                       FT_UInt32  char_code )
  {
    if ( char_code >= 0x10000UL )
      return 0;

    if ( cmap->flags & TT_CMAP_FLAG_UNSORTED )
      return tt_cmap4_char_map_linear( cmap, &char_code, 0 );
    else
      return tt_cmap4_char_map_binary( cmap, &char_code, 0 );
  }